

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O0

string * __thiscall
libtorrent::lexically_relative_abi_cxx11_
          (string *__return_storage_ptr__,libtorrent *this,string_view base,string_view target)

{
  basic_string_view<char,_std::char_traits<char>_> __y;
  basic_string_view<char,_std::char_traits<char>_> __x;
  char *pcVar1;
  size_t sVar2;
  char *pcVar3;
  bool bVar4;
  const_reference pvVar5;
  const_iterator __first;
  const_iterator __last;
  difference_type dVar6;
  size_t sVar7;
  string_view last;
  string_view last_00;
  int local_11c;
  char local_115;
  int i;
  size_t sStack_110;
  int num_steps;
  size_t local_108;
  char *local_100;
  basic_string_view<char,_std::char_traits<char>_> local_f0;
  char *local_e0;
  size_t local_d8;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  local_d0;
  basic_string_view<char,_std::char_traits<char>_> local_b0;
  char *local_a0;
  size_t local_98;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  local_90;
  undefined1 local_70 [8];
  string_view target_element;
  string_view base_element;
  string_view prev_target;
  string_view prev_base;
  string_view target_local;
  string_view base_local;
  string *ret;
  
  sVar7 = target._M_len;
  prev_base._M_str = base._M_str;
  last._M_len = base._M_len;
  target_local._M_len = sVar7;
  target_local._M_str = (char *)this;
  bVar4 = ::std::basic_string_view<char,_std::char_traits<char>_>::empty
                    ((basic_string_view<char,_std::char_traits<char>_> *)&target_local._M_str);
  if ((!bVar4) &&
     (pvVar5 = ::std::basic_string_view<char,_std::char_traits<char>_>::back
                         ((basic_string_view<char,_std::char_traits<char>_> *)&target_local._M_str),
     *pvVar5 == '/')) {
    ::std::basic_string_view<char,_std::char_traits<char>_>::remove_suffix
              ((basic_string_view<char,_std::char_traits<char>_> *)&target_local._M_str,1);
  }
  bVar4 = ::std::basic_string_view<char,_std::char_traits<char>_>::empty
                    ((basic_string_view<char,_std::char_traits<char>_> *)&prev_base._M_str);
  if ((!bVar4) &&
     (pvVar5 = ::std::basic_string_view<char,_std::char_traits<char>_>::back
                         ((basic_string_view<char,_std::char_traits<char>_> *)&prev_base._M_str),
     *pvVar5 == '/')) {
    ::std::basic_string_view<char,_std::char_traits<char>_>::remove_suffix
              ((basic_string_view<char,_std::char_traits<char>_> *)&prev_base._M_str,1);
  }
  do {
    bVar4 = ::std::basic_string_view<char,_std::char_traits<char>_>::empty
                      ((basic_string_view<char,_std::char_traits<char>_> *)&target_local._M_str);
    pcVar3 = target_local._M_str;
    sVar2 = target_local._M_len;
    pcVar1 = prev_base._M_str;
    if (bVar4) break;
    prev_base._M_len = last._M_len;
    ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)&target_element._M_str);
    ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)local_70);
    local_a0 = target_local._M_str;
    last._M_str = (char *)0x2f;
    local_98 = last._M_len;
    aux::split_string(&local_90,(aux *)target_local._M_str,last,(char)sVar7);
    ::std::
    tie<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>>
              (&local_b0,(basic_string_view<char,_std::char_traits<char>_> *)&target_element._M_str)
    ;
    ::std::
    tuple<std::basic_string_view<char,std::char_traits<char>>&,std::basic_string_view<char,std::char_traits<char>>&>
    ::operator=((tuple<std::basic_string_view<char,std::char_traits<char>>&,std::basic_string_view<char,std::char_traits<char>>&>
                 *)&local_b0,
                (pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
                 *)&local_90);
    local_e0 = prev_base._M_str;
    local_d8 = target_local._M_len;
    last_00._M_str = (char *)0x2f;
    last_00._M_len = target_local._M_len;
    aux::split_string(&local_d0,(aux *)prev_base._M_str,last_00,(char)sVar7);
    ::std::
    tie<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>>
              (&local_f0,(basic_string_view<char,_std::char_traits<char>_> *)local_70);
    ::std::
    tuple<std::basic_string_view<char,std::char_traits<char>>&,std::basic_string_view<char,std::char_traits<char>>&>
    ::operator=((tuple<std::basic_string_view<char,std::char_traits<char>>&,std::basic_string_view<char,std::char_traits<char>>&>
                 *)&local_f0,
                (pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
                 *)&local_d0);
    local_100 = target_element._M_str;
    sStack_110 = (size_t)local_70;
    local_108 = target_element._M_len;
    __x._M_str = (char *)base_element._M_len;
    __x._M_len = (size_t)target_element._M_str;
    __y._M_str = (char *)target_element._M_len;
    __y._M_len = (size_t)local_70;
    bVar4 = ::std::operator==(__x,__y);
  } while (bVar4);
  prev_base._M_str = pcVar1;
  target_local._M_len = sVar2;
  target_local._M_str = pcVar3;
  __first = ::std::basic_string_view<char,_std::char_traits<char>_>::begin
                      ((basic_string_view<char,_std::char_traits<char>_> *)&target_local._M_str);
  __last = ::std::basic_string_view<char,_std::char_traits<char>_>::end
                     ((basic_string_view<char,_std::char_traits<char>_> *)&target_local._M_str);
  local_115 = '/';
  dVar6 = ::std::count<char_const*,char>(__first,__last,&local_115);
  bVar4 = ::std::basic_string_view<char,_std::char_traits<char>_>::empty
                    ((basic_string_view<char,_std::char_traits<char>_> *)&target_local._M_str);
  i = (int)dVar6 + (uint)!bVar4;
  ::std::__cxx11::string::string((string *)__return_storage_ptr__);
  for (local_11c = 0; local_11c < i; local_11c = local_11c + 1) {
    ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"../");
  }
  ::std::__cxx11::string::operator+=
            ((string *)__return_storage_ptr__,
             (basic_string_view<char,_std::char_traits<char>_> *)&prev_base._M_str);
  return __return_storage_ptr__;
}

Assistant:

std::string lexically_relative(string_view base, string_view target)
	{
		// first, strip trailing directory separators
		if (!base.empty() && base.back() == TORRENT_SEPARATOR_CHAR)
			base.remove_suffix(1);
		if (!target.empty() && target.back() == TORRENT_SEPARATOR_CHAR)
			target.remove_suffix(1);

		// strip common path elements
		for (;;)
		{
			if (base.empty()) break;
			string_view prev_base = base;
			string_view prev_target = target;

			string_view base_element;
			string_view target_element;
			std::tie(base_element, base) = aux::split_string(base, TORRENT_SEPARATOR_CHAR);
			std::tie(target_element, target) = aux::split_string(target, TORRENT_SEPARATOR_CHAR);
			if (base_element == target_element) continue;

			base = prev_base;
			target = prev_target;
			break;
		}

		// count number of path elements left in base, and prepend that number of
		// "../" to target

		// base always points to a directory. There's an implied directory
		// separator at the end of it
		int const num_steps = static_cast<int>(std::count(
			base.begin(), base.end(), TORRENT_SEPARATOR_CHAR)) + (base.empty() ? 0 : 1);
		std::string ret;
		for (int i = 0; i < num_steps; ++i)
			ret += ".." TORRENT_SEPARATOR;

		ret += target;
		return ret;
	}